

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timDump.c
# Opt level: O3

Vec_Str_t * Tim_ManSave(Tim_Man_t *p,int fHieOnly)

{
  int *piVar1;
  float *pfVar2;
  Tim_Obj_t *pTVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  Vec_Str_t *vOut;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  
  vOut = (Vec_Str_t *)malloc(0x10);
  vOut->nCap = 10000;
  vOut->nSize = 0;
  pcVar7 = (char *)malloc(10000);
  vOut->pArray = pcVar7;
  iVar11 = 0;
  iVar5 = 10000;
  iVar12 = 0x18;
  while( true ) {
    if (iVar11 == iVar5) {
      if (iVar5 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        uVar6 = iVar5 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc((ulong)uVar6);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,(ulong)uVar6);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = uVar6;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar5 = vOut->nSize;
    vOut->nSize = iVar5 + 1;
    pcVar7[iVar5] = (char)(1 >> ((byte)iVar12 & 0x1f));
    if (iVar12 == 0) break;
    iVar5 = vOut->nCap;
    iVar11 = vOut->nSize;
    iVar12 = iVar12 + -8;
  }
  iVar5 = Tim_ManCiNum(p);
  iVar11 = 0x18;
  do {
    uVar6 = vOut->nSize;
    if (uVar6 == vOut->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar4);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar4;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar12 = vOut->nSize;
    vOut->nSize = iVar12 + 1;
    pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar5 = Tim_ManCoNum(p);
  iVar11 = 0x18;
  do {
    uVar6 = vOut->nSize;
    if (uVar6 == vOut->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar4);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar4;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar12 = vOut->nSize;
    vOut->nSize = iVar12 + 1;
    pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar5 = Tim_ManPiNum(p);
  iVar11 = 0x18;
  do {
    uVar6 = vOut->nSize;
    if (uVar6 == vOut->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar4);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar4;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar12 = vOut->nSize;
    vOut->nSize = iVar12 + 1;
    pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar5 = Tim_ManPoNum(p);
  iVar11 = 0x18;
  do {
    uVar6 = vOut->nSize;
    if (uVar6 == vOut->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar4);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar4;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar12 = vOut->nSize;
    vOut->nSize = iVar12 + 1;
    pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar5 = Tim_ManBoxNum(p);
  iVar11 = 0x18;
  do {
    uVar6 = vOut->nSize;
    if (uVar6 == vOut->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,0x10);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar6 * 2;
        if (vOut->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(vOut->pArray,sVar4);
        }
        vOut->pArray = pcVar7;
        vOut->nCap = (int)sVar4;
      }
    }
    else {
      pcVar7 = vOut->pArray;
    }
    iVar12 = vOut->nSize;
    vOut->nSize = iVar12 + 1;
    pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  iVar5 = Tim_ManBoxNum(p);
  if ((0 < iVar5) && (pVVar8 = p->vBoxes, 0 < pVVar8->nSize)) {
    lVar10 = 0;
    do {
      piVar1 = (int *)pVVar8->pArray[lVar10];
      iVar5 = Tim_ManBoxInputNum(p,*piVar1);
      iVar11 = 0x18;
      do {
        uVar6 = vOut->nSize;
        if (uVar6 == vOut->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar6 * 2;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar4);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar4);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar4;
          }
        }
        else {
          pcVar7 = vOut->pArray;
        }
        iVar12 = vOut->nSize;
        vOut->nSize = iVar12 + 1;
        pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar5 = Tim_ManBoxOutputNum(p,*piVar1);
      iVar11 = 0x18;
      do {
        uVar6 = vOut->nSize;
        if (uVar6 == vOut->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar6 * 2;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar4);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar4);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar4;
          }
        }
        else {
          pcVar7 = vOut->pArray;
        }
        iVar12 = vOut->nSize;
        vOut->nSize = iVar12 + 1;
        pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar5 = Tim_ManBoxDelayTableId(p,*piVar1);
      iVar11 = 0x18;
      do {
        uVar6 = vOut->nSize;
        if (uVar6 == vOut->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar6 * 2;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar4);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar4);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar4;
          }
        }
        else {
          pcVar7 = vOut->pArray;
        }
        iVar12 = vOut->nSize;
        vOut->nSize = iVar12 + 1;
        pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      iVar5 = Tim_ManBoxCopy(p,*piVar1);
      iVar11 = 0x18;
      do {
        uVar6 = vOut->nSize;
        if (uVar6 == vOut->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,0x10);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar6 * 2;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar4);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,sVar4);
            }
            vOut->pArray = pcVar7;
            vOut->nCap = (int)sVar4;
          }
        }
        else {
          pcVar7 = vOut->pArray;
        }
        iVar12 = vOut->nSize;
        vOut->nSize = iVar12 + 1;
        pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
        iVar11 = iVar11 + -8;
      } while (iVar11 != -8);
      lVar10 = lVar10 + 1;
      pVVar8 = p->vBoxes;
    } while (lVar10 < pVVar8->nSize);
  }
  if (fHieOnly == 0) {
    iVar5 = Tim_ManDelayTableNum(p);
    iVar11 = 0x18;
    do {
      uVar6 = vOut->nSize;
      if (uVar6 == vOut->nCap) {
        if ((int)uVar6 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vOut->pArray,0x10);
          }
          vOut->pArray = pcVar7;
          vOut->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar6 * 2;
          if (vOut->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar4);
          }
          else {
            pcVar7 = (char *)realloc(vOut->pArray,sVar4);
          }
          vOut->pArray = pcVar7;
          vOut->nCap = (int)sVar4;
        }
      }
      else {
        pcVar7 = vOut->pArray;
      }
      iVar12 = vOut->nSize;
      vOut->nSize = iVar12 + 1;
      pcVar7[iVar12] = (char)(iVar5 >> ((byte)iVar11 & 0x1f));
      iVar11 = iVar11 + -8;
    } while (iVar11 != -8);
    iVar5 = Tim_ManDelayTableNum(p);
    if ((0 < iVar5) && (pVVar8 = p->vDelayTables, 0 < pVVar8->nSize)) {
      uVar9 = 0;
      do {
        pfVar2 = (float *)pVVar8->pArray[uVar9];
        fVar15 = *pfVar2;
        if (uVar9 != (uint)(int)fVar15) {
          __assert_fail("(int)pDelayTable[0] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timDump.c"
                        ,0x53,"Vec_Str_t *Tim_ManSave(Tim_Man_t *, int)");
        }
        iVar5 = 0x18;
        do {
          uVar6 = vOut->nSize;
          if (uVar6 == vOut->nCap) {
            if ((int)uVar6 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar6 * 2;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar4);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = vOut->pArray;
          }
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          pcVar7[iVar11] = (char)((int)fVar15 >> ((byte)iVar5 & 0x1f));
          iVar5 = iVar5 + -8;
        } while (iVar5 != -8);
        fVar15 = pfVar2[1];
        iVar5 = 0x18;
        do {
          uVar6 = vOut->nSize;
          if (uVar6 == vOut->nCap) {
            if ((int)uVar6 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar6 * 2;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar4);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = vOut->pArray;
          }
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          pcVar7[iVar11] = (char)((int)fVar15 >> ((byte)iVar5 & 0x1f));
          iVar5 = iVar5 + -8;
        } while (iVar5 != -8);
        fVar15 = pfVar2[2];
        iVar5 = 0x18;
        do {
          uVar6 = vOut->nSize;
          if (uVar6 == vOut->nCap) {
            if ((int)uVar6 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar6 * 2;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar4);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = vOut->pArray;
          }
          iVar11 = vOut->nSize;
          vOut->nSize = iVar11 + 1;
          pcVar7[iVar11] = (char)((int)fVar15 >> ((byte)iVar5 & 0x1f));
          iVar5 = iVar5 + -8;
        } while (iVar5 != -8);
        uVar6 = (int)(float)((ulong)*(undefined8 *)(pfVar2 + 1) >> 0x20) *
                (int)(float)*(undefined8 *)(pfVar2 + 1);
        if (0 < (int)uVar6) {
          uVar13 = 0;
          do {
            Vec_StrPutF(vOut,pfVar2[uVar13 + 3]);
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        uVar9 = uVar9 + 1;
        pVVar8 = p->vDelayTables;
      } while ((long)uVar9 < (long)pVVar8->nSize);
    }
    iVar5 = p->nCis;
    if (0 < iVar5) {
      lVar10 = 8;
      lVar14 = 0;
      do {
        pTVar3 = p->pCis;
        if (pTVar3 == (Tim_Obj_t *)0x0) break;
        if (*(int *)((long)&pTVar3->Id + lVar10) < 0) {
          fVar15 = Tim_ManGetCiArrival(p,*(int *)((long)pTVar3 + lVar10 + -8));
          Vec_StrPutF(vOut,fVar15);
          iVar5 = p->nCis;
        }
        lVar14 = lVar14 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar14 < iVar5);
    }
    iVar5 = p->nCos;
    if (0 < iVar5) {
      lVar10 = 8;
      lVar14 = 0;
      do {
        pTVar3 = p->pCos;
        if (pTVar3 == (Tim_Obj_t *)0x0) {
          return vOut;
        }
        if (*(int *)((long)&pTVar3->Id + lVar10) < 0) {
          fVar15 = Tim_ManGetCoRequired(p,*(int *)((long)pTVar3 + lVar10 + -8));
          Vec_StrPutF(vOut,fVar15);
          iVar5 = p->nCos;
        }
        lVar14 = lVar14 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar14 < iVar5);
    }
  }
  return vOut;
}

Assistant:

Vec_Str_t * Tim_ManSave( Tim_Man_t * p, int fHieOnly )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    Vec_Str_t * vStr;
    float * pDelayTable;
    int i, k, TableSize;
    // create output stream
    vStr = Vec_StrAlloc( 10000 );
    // dump version number
    Vec_StrPutI_ne( vStr, TIM_DUMP_VER_NUM );
    // save CI/CO counts
    Vec_StrPutI_ne( vStr, Tim_ManCiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManCoNum(p) );
    // save PI/PO counts
    Vec_StrPutI_ne( vStr, Tim_ManPiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManPoNum(p) );
    // save number of boxes
    Vec_StrPutI_ne( vStr, Tim_ManBoxNum(p) );
    // for each box, save num_inputs, num_outputs, delay table ID, and copy field
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_StrPutI_ne( vStr, Tim_ManBoxInputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxOutputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxDelayTableId(p, pBox->iBox) ); // can be -1 if delay table is not given
        Vec_StrPutI_ne( vStr, Tim_ManBoxCopy(p, pBox->iBox) );         // can be -1 if the copy is node defined
        //Vec_StrPutI_ne( vStr, Tim_ManBoxIsBlack(p, pBox->iBox) );
    }
    if ( fHieOnly )
        return vStr;
    // save the number of delay tables
    Vec_StrPutI_ne( vStr, Tim_ManDelayTableNum(p) );
    // save the delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pDelayTable, i )
    {
        assert( (int)pDelayTable[0] == i );
        // save table ID and dimensions (inputs x outputs)
        Vec_StrPutI_ne( vStr, (int)pDelayTable[0] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[1] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[2] );
        // save table contents
        TableSize = (int)pDelayTable[1] * (int)pDelayTable[2];
        for ( k = 0; k < TableSize; k++ )
            Vec_StrPutF( vStr, pDelayTable[k+3] );
    }
    // save PI arrival times
    Tim_ManForEachPi( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCiArrival(p, pObj->Id) );
    // save PO required times
    Tim_ManForEachPo( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCoRequired(p, pObj->Id) );
    return vStr;
}